

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O0

void __thiscall CServerBrowserFilter::CServerFilter::Filter(CServerFilter *this)

{
  int iVar1;
  CServerEntry *pCVar2;
  IFriends *pIVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  int *piVar8;
  char *pcVar9;
  CConfig *pCVar10;
  CServerFilter *in_RDI;
  bool bVar11;
  int p_2;
  int p_1;
  int MatchFound;
  int p;
  int Index;
  bool Included;
  bool DoInclude;
  bool Excluded;
  int RelevantClientCount;
  int Filtered;
  int i;
  int NumServers;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  CClient *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  int local_3c;
  int local_30;
  int local_2c;
  int local_24;
  int local_20;
  int local_18;
  int local_10;
  
  iVar1 = in_RDI->m_pServerBrowserFilter->m_NumServers;
  in_RDI->m_NumSortedServers = 0;
  in_RDI->m_NumSortedPlayers = 0;
  if (in_RDI->m_SortedServersCapacity < iVar1) {
    if (in_RDI->m_pSortedServerlist != (int *)0x0) {
      mem_free((void *)0x139104);
    }
    iVar7 = maximum<int>(1000,iVar1 + iVar1 / 2);
    in_RDI->m_SortedServersCapacity = iVar7;
    piVar8 = (int *)mem_alloc(0);
    in_RDI->m_pSortedServerlist = piVar8;
  }
  local_10 = 0;
  do {
    if (iVar1 <= local_10) {
      return;
    }
    bVar6 = false;
    if (((in_RDI->m_FilterInfo).m_SortHash & 0x80U) == 0) {
      local_3c = (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_NumClients;
    }
    else {
      local_3c = (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_NumPlayers;
    }
    local_18 = local_3c;
    if ((((in_RDI->m_FilterInfo).m_SortHash & 0x10U) != 0) &&
       (local_18 = local_3c -
                   (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                   m_NumBotPlayers, ((in_RDI->m_FilterInfo).m_SortHash & 0x80U) == 0)) {
      local_18 = local_18 -
                 (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                 m_NumBotSpectators;
    }
    if ((((in_RDI->m_FilterInfo).m_SortHash & 0x20U) == 0) || (local_18 != 0)) {
      if ((((in_RDI->m_FilterInfo).m_SortHash & 0x40U) == 0) ||
         (((((in_RDI->m_FilterInfo).m_SortHash & 0x80U) == 0 ||
           ((in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_NumPlayers !=
            (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_MaxPlayers)) &&
          ((in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_NumClients !=
           (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_MaxClients)))) {
        if ((((in_RDI->m_FilterInfo).m_SortHash & 0x200U) == 0) ||
           (((in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_Flags & 1U) == 0))
        {
          if ((((in_RDI->m_FilterInfo).m_SortHash & 0x400U) == 0) ||
             (((in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_Favorite & 1U)
              != 0)) {
            if ((((in_RDI->m_FilterInfo).m_SortHash & 0x1000U) == 0) ||
               (((in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_Flags & 2U) !=
                0)) {
              if ((((in_RDI->m_FilterInfo).m_SortHash & 0x2000U) == 0) ||
                 (((in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_Flags & 4U)
                  != 0)) {
                if ((in_RDI->m_FilterInfo).m_Ping <
                    (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_Latency) {
                  bVar6 = true;
                }
                else if ((((in_RDI->m_FilterInfo).m_SortHash & 0x800U) == 0) ||
                        (iVar7 = str_comp_num(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0)
                        , iVar7 == 0)) {
                  if (((in_RDI->m_FilterInfo).m_aAddress[0] == '\0') ||
                     (pcVar9 = str_find_nocase(in_stack_ffffffffffffffb8,
                                               in_stack_ffffffffffffffb0->m_aName),
                     pcVar9 != (char *)0x0)) {
                    iVar7 = CServerFilterInfo::IsLevelFiltered
                                      (&in_RDI->m_FilterInfo,
                                       (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->
                                       m_Info).m_ServerLevel);
                    if (iVar7 == 0) {
                      if ((in_RDI->m_FilterInfo).m_aGametype[0][0] != '\0') {
                        bVar11 = false;
                        bVar4 = false;
                        bVar5 = 0;
                        local_20 = 0;
LAB_00139527:
                        if ((7 < local_20) ||
                           ((in_RDI->m_FilterInfo).m_aGametype[local_20][0] == '\0'))
                        goto LAB_0013960e;
                        if ((in_RDI->m_FilterInfo).m_aGametypeExclusive[local_20] == '\0') {
                          bVar4 = true;
                          iVar7 = str_comp_nocase(in_stack_ffffffffffffffa0,
                                                  in_stack_ffffffffffffff98);
                          if (iVar7 == 0) {
                            bVar5 = 1;
                            goto LAB_0013960e;
                          }
LAB_001395fc:
                          local_20 = local_20 + 1;
                          goto LAB_00139527;
                        }
                        iVar7 = str_comp_nocase(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
                        ;
                        if (iVar7 != 0) goto LAB_001395fc;
                        bVar11 = true;
LAB_0013960e:
                        bVar6 = true;
                        if ((!bVar11) && (bVar6 = false, bVar4)) {
                          bVar6 = (bool)(bVar5 ^ 1);
                        }
                      }
                      if ((!bVar6) && (((in_RDI->m_FilterInfo).m_SortHash & 0x4000U) != 0)) {
                        bVar6 = true;
                        for (local_24 = 0;
                            local_24 <
                            (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                            m_NumClients; local_24 = local_24 + 1) {
                          if ((in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                              m_aClients[local_24].m_Country == (in_RDI->m_FilterInfo).m_Country) {
                            bVar6 = false;
                            break;
                          }
                        }
                      }
                      if ((!bVar6) &&
                         (pCVar10 = Config(in_RDI), pCVar10->m_BrFilterString[0] != '\0')) {
                        (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                        m_QuickSearchHit = 0;
                        in_stack_ffffffffffffffb8 =
                             (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                             m_aName;
                        Config(in_RDI);
                        pcVar9 = str_find_nocase(in_stack_ffffffffffffffb8,
                                                 in_stack_ffffffffffffffb0->m_aName);
                        bVar11 = pcVar9 != (char *)0x0;
                        if (bVar11) {
                          pCVar2 = in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10];
                          (pCVar2->m_Info).m_QuickSearchHit = (pCVar2->m_Info).m_QuickSearchHit | 1;
                        }
                        for (local_2c = 0;
                            local_2c <
                            (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                            m_NumClients; local_2c = local_2c + 1) {
                          in_stack_ffffffffffffffb0 =
                               (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                               m_aClients + local_2c;
                          Config(in_RDI);
                          pcVar9 = str_find_nocase(in_stack_ffffffffffffffb8,
                                                   in_stack_ffffffffffffffb0->m_aName);
                          if (pcVar9 != (char *)0x0) {
LAB_0013987c:
                            bVar11 = true;
                            pCVar2 = in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10];
                            (pCVar2->m_Info).m_QuickSearchHit =
                                 (pCVar2->m_Info).m_QuickSearchHit | 2;
                            break;
                          }
                          Config(in_RDI);
                          pcVar9 = str_find_nocase(in_stack_ffffffffffffffb8,
                                                   in_stack_ffffffffffffffb0->m_aName);
                          if (pcVar9 != (char *)0x0) goto LAB_0013987c;
                        }
                        in_stack_ffffffffffffffa0 =
                             (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                             m_aMap;
                        Config(in_RDI);
                        pcVar9 = str_find_nocase(in_stack_ffffffffffffffb8,
                                                 in_stack_ffffffffffffffb0->m_aName);
                        if (pcVar9 != (char *)0x0) {
                          bVar11 = true;
                          pCVar2 = in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10];
                          (pCVar2->m_Info).m_QuickSearchHit = (pCVar2->m_Info).m_QuickSearchHit | 4;
                        }
                        in_stack_ffffffffffffff98 =
                             (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                             m_aGameType;
                        Config(in_RDI);
                        pcVar9 = str_find_nocase(in_stack_ffffffffffffffb8,
                                                 in_stack_ffffffffffffffb0->m_aName);
                        if (pcVar9 != (char *)0x0) {
                          bVar11 = true;
                          pCVar2 = in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10];
                          (pCVar2->m_Info).m_QuickSearchHit = (pCVar2->m_Info).m_QuickSearchHit | 8;
                        }
                        if (!bVar11) {
                          bVar6 = true;
                        }
                      }
                    }
                    else {
                      bVar6 = true;
                    }
                  }
                  else {
                    bVar6 = true;
                  }
                }
                else {
                  bVar6 = true;
                }
              }
              else {
                bVar6 = true;
              }
            }
            else {
              bVar6 = true;
            }
          }
          else {
            bVar6 = true;
          }
        }
        else {
          bVar6 = true;
        }
      }
      else {
        bVar6 = true;
      }
    }
    else {
      bVar6 = true;
    }
    if (!bVar6) {
      (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_FriendState = 0;
      for (local_30 = 0;
          local_30 < (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_NumClients
          ; local_30 = local_30 + 1) {
        pIVar3 = in_RDI->m_pServerBrowserFilter->m_pFriends;
        iVar7 = (*(pIVar3->super_IInterface)._vptr_IInterface[5])
                          (pIVar3,(in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info)
                                  .m_aClients + local_30,
                           (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                           m_aClients[local_30].m_aClan);
        (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_aClients[local_30].
        m_FriendState = iVar7;
        iVar7 = maximum<int>((in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                             m_FriendState,
                             (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).
                             m_aClients[local_30].m_FriendState);
        (in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_FriendState = iVar7;
      }
      if ((((in_RDI->m_FilterInfo).m_SortHash & 0x100U) == 0) ||
         ((in_RDI->m_pServerBrowserFilter->m_ppServerlist[local_10]->m_Info).m_FriendState != 0)) {
        iVar7 = in_RDI->m_NumSortedServers;
        in_RDI->m_NumSortedServers = iVar7 + 1;
        in_RDI->m_pSortedServerlist[iVar7] = local_10;
        in_RDI->m_NumSortedPlayers = local_18 + in_RDI->m_NumSortedPlayers;
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void CServerBrowserFilter::CServerFilter::Filter()
{
	int NumServers = m_pServerBrowserFilter->m_NumServers;
	m_NumSortedServers = 0;
	m_NumSortedPlayers = 0;

	// allocate the sorted list
	if(m_SortedServersCapacity < NumServers)
	{
		if(m_pSortedServerlist)
			mem_free(m_pSortedServerlist);
		m_SortedServersCapacity = maximum(1000, NumServers+NumServers/2);
		m_pSortedServerlist = (int *)mem_alloc(m_SortedServersCapacity*sizeof(int));
	}

	// filter the servers
	for(int i = 0; i < NumServers; i++)
	{
		int Filtered = 0;

		int RelevantClientCount = (m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS) ? m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumPlayers : m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients;
		if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_BOTS)
		{
			RelevantClientCount -= m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumBotPlayers;
			if(!(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS))
				RelevantClientCount -= m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumBotSpectators;
		}

		if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_EMPTY && RelevantClientCount == 0)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FULL && ((m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS && m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumPlayers == m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_MaxPlayers) ||
				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients == m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_MaxClients))
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PW && m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Flags&IServerBrowser::FLAG_PASSWORD)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FAVORITE && !m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Favorite)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PURE && !(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Flags&IServerBrowser::FLAG_PURE))
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PURE_MAP &&  !(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Flags&IServerBrowser::FLAG_PUREMAP))
			Filtered = 1;
		else if(m_FilterInfo.m_Ping < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Latency)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_COMPAT_VERSION && str_comp_num(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aVersion, m_pServerBrowserFilter->m_aNetVersion, 3) != 0)
			Filtered = 1;
		else if(m_FilterInfo.m_aAddress[0] && !str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aAddress, m_FilterInfo.m_aAddress))
			Filtered = 1;
		else if(m_FilterInfo.IsLevelFiltered(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_ServerLevel))
			Filtered = 1;
		else
		{
			if(m_FilterInfo.m_aGametype[0][0])
			{
				bool Excluded = false, DoInclude = false, Included = false;
				for(int Index = 0; Index < CServerFilterInfo::MAX_GAMETYPES; ++Index)
				{
					if(!m_FilterInfo.m_aGametype[Index][0])
						break;
					if(m_FilterInfo.m_aGametypeExclusive[Index])
					{
						if(!str_comp_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aGameType, m_FilterInfo.m_aGametype[Index]))
						{
							Excluded = true;
							break;
						}
					}
					else
					{
						DoInclude = true;
						if(!str_comp_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aGameType, m_FilterInfo.m_aGametype[Index]))
						{
							Included = true;
							break;
						}
					}
				}
				Filtered = Excluded || (DoInclude && !Included);
			}

			if(!Filtered && m_FilterInfo.m_SortHash&IServerBrowser::FILTER_COUNTRY)
			{
				Filtered = 1;
				// match against player country
				for(int p = 0; p < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients; p++)
				{
					if(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_Country == m_FilterInfo.m_Country)
					{
						Filtered = 0;
						break;
					}
				}
			}

			if(!Filtered && Config()->m_BrFilterString[0] != 0)
			{
				int MatchFound = 0;

				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit = 0;

				// match against server name
				if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aName, Config()->m_BrFilterString))
				{
					MatchFound = 1;
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_SERVERNAME;
				}

				// match against players
				for(int p = 0; p < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients; p++)
				{
					if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aName, Config()->m_BrFilterString) ||
						str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aClan, Config()->m_BrFilterString))
					{
						MatchFound = 1;
						m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_PLAYER;
						break;
					}
				}

				// match against map
				if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aMap, Config()->m_BrFilterString))
				{
					MatchFound = 1;
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_MAPNAME;
				}

				// match against game type
				if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aGameType, Config()->m_BrFilterString))
				{
					MatchFound = 1;
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_GAMETYPE;
				}

				if(!MatchFound)
					Filtered = 1;
			}
		}

		if(Filtered == 0)
		{
			// check for friend
			m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState = CContactInfo::CONTACT_NO;
			for(int p = 0; p < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients; p++)
			{
				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_FriendState = m_pServerBrowserFilter->m_pFriends->GetFriendState(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aName,
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aClan);
				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState = maximum(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState, m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_FriendState);
			}

			if(!(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FRIENDS) || m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState != CContactInfo::CONTACT_NO)
			{
				m_pSortedServerlist[m_NumSortedServers++] = i;
				m_NumSortedPlayers += RelevantClientCount;
			}
		}
	}
}